

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.c
# Opt level: O0

deCommandLine * deCommandLine_parse(char *commandLine)

{
  char cVar1;
  deBool dVar2;
  deMemPool *pool;
  size_t sVar3;
  char *pcVar4;
  deCommandLine *ptr;
  char **ppcVar5;
  int iVar6;
  CharPtrArray *local_58;
  deCommandLine *cmdLine;
  int local_40;
  char c;
  int iStack_3c;
  char strChr;
  int argNdx;
  int pos;
  char *outPtr;
  char *buf;
  CharPtrArray *args;
  deMemPool *tmpPool;
  char *commandLine_local;
  
  pool = deMemPool_createRoot((deMemPoolUtil *)0x0,0);
  if (pool == (deMemPool *)0x0) {
    local_58 = (CharPtrArray *)0x0;
  }
  else {
    local_58 = CharPtrArray_create(pool);
  }
  if (local_58 == (CharPtrArray *)0x0) {
    if (pool != (deMemPool *)0x0) {
      deMemPool_destroy(pool);
    }
  }
  else {
    sVar3 = strlen(commandLine);
    pcVar4 = (char *)deCalloc(sVar3 + 1);
    iStack_3c = 0;
    cmdLine._7_1_ = '\0';
    if ((pcVar4 == (char *)0x0) ||
       (dVar2 = CharPtrArray_pushBack(local_58,pcVar4), cVar1 = cmdLine._7_1_, _argNdx = pcVar4,
       dVar2 == 0)) {
      deMemPool_destroy(pool);
    }
    else {
      while (cmdLine._7_1_ = cVar1, commandLine[iStack_3c] != '\0') {
        iVar6 = iStack_3c + 1;
        cVar1 = commandLine[iStack_3c];
        if ((cmdLine._7_1_ == '\0') || (cVar1 != '\\')) {
          iStack_3c = iVar6;
          if ((cmdLine._7_1_ == '\0') || (cVar1 != cmdLine._7_1_)) {
            if ((cmdLine._7_1_ != '\0') || ((cVar1 != '\"' && (cVar1 != '\'')))) {
              if ((cVar1 == ' ') && (cmdLine._7_1_ == '\0')) {
                *_argNdx = '\0';
                dVar2 = CharPtrArray_pushBack(local_58,_argNdx + 1);
                if (dVar2 == 0) {
                  deFree(pcVar4);
                  deMemPool_destroy(pool);
                  return (deCommandLine *)0x0;
                }
              }
              else {
                *_argNdx = cVar1;
              }
              _argNdx = _argNdx + 1;
              cVar1 = cmdLine._7_1_;
            }
          }
          else {
            cmdLine._7_1_ = '\0';
            cVar1 = cmdLine._7_1_;
          }
        }
        else {
          cVar1 = commandLine[iVar6];
          if (cVar1 == 'n') {
            *_argNdx = '\n';
          }
          else if (cVar1 == 't') {
            *_argNdx = '\t';
          }
          else {
            *_argNdx = cVar1;
          }
          _argNdx = _argNdx + 1;
          cVar1 = cmdLine._7_1_;
          iStack_3c = iStack_3c + 2;
        }
      }
      *_argNdx = '\0';
      ptr = (deCommandLine *)deCalloc(0x18);
      if (ptr != (deCommandLine *)0x0) {
        iVar6 = CharPtrArray_getNumElements(local_58);
        ppcVar5 = (char **)deCalloc((long)iVar6 << 3);
        ptr->args = ppcVar5;
        if (ppcVar5 != (char **)0x0) {
          iVar6 = CharPtrArray_getNumElements(local_58);
          ptr->numArgs = iVar6;
          ptr->argBuf = pcVar4;
          for (local_40 = 0; local_40 < ptr->numArgs; local_40 = local_40 + 1) {
            pcVar4 = CharPtrArray_get(local_58,local_40);
            ptr->args[local_40] = pcVar4;
          }
          deMemPool_destroy(pool);
          return ptr;
        }
      }
      deFree(ptr);
      deFree(pcVar4);
      deMemPool_destroy(pool);
    }
  }
  return (deCommandLine *)0x0;
}

Assistant:

deCommandLine* deCommandLine_parse (const char* commandLine)
{
	deMemPool*		tmpPool		= deMemPool_createRoot(DE_NULL, 0);
	CharPtrArray*	args		= tmpPool ? CharPtrArray_create(tmpPool) : DE_NULL;
	char*			buf			= DE_NULL;
	char*			outPtr;
	int				pos;
	int				argNdx;
	char			strChr;

	if (!args)
	{
		if (tmpPool)
			deMemPool_destroy(tmpPool);
		return DE_NULL;
	}

	DE_ASSERT(commandLine);

	/* Create buffer for args (no expansion can happen). */
	buf		= (char*)deCalloc(strlen(commandLine)+1);
	pos		= 0;
	argNdx	= 0;
	outPtr	= buf;
	strChr	= 0;

	if (!buf || !CharPtrArray_pushBack(args, buf))
	{
		deMemPool_destroy(tmpPool);
		return DE_NULL;
	}

	while (commandLine[pos] != 0)
	{
		char c = commandLine[pos++];

		if (strChr != 0 && c == '\\')
		{
			/* Escape. */
			c = commandLine[pos++];
			switch (c)
			{
				case 'n':	*outPtr++ = '\n';	break;
				case 't':	*outPtr++ = '\t';	break;
				default:	*outPtr++ = c;		break;
			}
		}
		else if (strChr != 0 && c == strChr)
		{
			/* String end. */
			strChr = 0;
		}
		else if (strChr == 0 && (c == '"' || c == '\''))
		{
			/* String start. */
			strChr = c;
		}
		else if (c == ' ' && strChr == 0)
		{
			/* Arg end. */
			*outPtr++		 = 0;
			argNdx			+= 1;
			if (!CharPtrArray_pushBack(args, outPtr))
			{
				deFree(buf);
				deMemPool_destroy(tmpPool);
				return DE_NULL;
			}
		}
		else
			*outPtr++ = c;
	}

	DE_ASSERT(commandLine[pos] == 0);

	/* Terminate last arg. */
	*outPtr = 0;

	/* Create deCommandLine. */
	{
		deCommandLine* cmdLine = (deCommandLine*)deCalloc(sizeof(deCommandLine));

		if (!cmdLine || !(cmdLine->args = (char**)deCalloc(sizeof(char*)*(size_t)CharPtrArray_getNumElements(args))))
		{
			deFree(cmdLine);
			deFree(buf);
			deMemPool_destroy(tmpPool);
			return DE_NULL;
		}

		cmdLine->numArgs	= CharPtrArray_getNumElements(args);
		cmdLine->argBuf		= buf;

		for (argNdx = 0; argNdx < cmdLine->numArgs; argNdx++)
			cmdLine->args[argNdx] = CharPtrArray_get(args, argNdx);

		deMemPool_destroy(tmpPool);
		return cmdLine;
	}
}